

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

void * mpc_export(mpc_input_t *i,void *p)

{
  int iVar1;
  mpc_input_t *in_RSI;
  mpc_input_t *in_RDI;
  char *q;
  void *in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  iVar1 = mpc_mem_ptr(in_RDI,in_RSI);
  local_8 = in_RSI;
  if (iVar1 != 0) {
    local_8 = (mpc_input_t *)malloc(0x40);
    memcpy(local_8,in_RSI,0x40);
    mpc_free(local_8,in_stack_ffffffffffffffd8);
  }
  return local_8;
}

Assistant:

static void *mpc_export(mpc_input_t *i, void *p) {
  char *q = NULL;
  if (!mpc_mem_ptr(i, p)) { return p; }
  q = malloc(sizeof(mpc_mem_t));
  memcpy(q, p, sizeof(mpc_mem_t));
  mpc_free(i, p);
  return q;
}